

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obstacle.cpp
# Opt level: O1

int __thiscall Obstacle::newPos(Obstacle *this,int pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = pos + this->_speed;
  iVar1 = iVar3;
  if (iVar3 < 0) {
    iVar1 = this->_limit;
  }
  iVar2 = 0;
  if (iVar3 <= this->_limit) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int Obstacle::newPos(int pos){
        if (pos + _speed > _limit){

            pos = 0;// to make its edge visible

        }else if(pos + _speed < 0){
            
            pos = _limit;

        }else{

            pos += _speed;
        }
        return pos;

    }